

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::BeginGroup(void)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  ImGuiGroupData *pIVar5;
  ImGuiContext *pIVar6;
  ImGuiGroupData *__dest;
  int iVar7;
  int iVar8;
  ImGuiContext *ctx;
  float fVar9;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  iVar2 = (GImGui->GroupStack).Size;
  iVar8 = iVar2 + 1;
  iVar3 = (GImGui->GroupStack).Capacity;
  if (iVar3 <= iVar2) {
    if (iVar3 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar3 / 2 + iVar3;
    }
    if (iVar7 <= iVar8) {
      iVar7 = iVar8;
    }
    if (iVar3 < iVar7) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiGroupData *)(*GImAllocatorAllocFunc)((long)iVar7 * 0x30,GImAllocatorUserData);
      pIVar5 = (pIVar6->GroupStack).Data;
      if (pIVar5 != (ImGuiGroupData *)0x0) {
        memcpy(__dest,pIVar5,(long)(pIVar6->GroupStack).Size * 0x30);
        pIVar5 = (pIVar6->GroupStack).Data;
        if ((pIVar5 != (ImGuiGroupData *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pIVar5,GImAllocatorUserData);
      }
      (pIVar6->GroupStack).Data = __dest;
      (pIVar6->GroupStack).Capacity = iVar7;
    }
  }
  (pIVar6->GroupStack).Size = iVar8;
  pIVar5 = (pIVar6->GroupStack).Data;
  pIVar5[iVar2].WindowID = pIVar4->ID;
  pIVar5[iVar2].BackupCursorPos = (pIVar4->DC).CursorPos;
  pIVar5[iVar2].BackupCursorMaxPos = (pIVar4->DC).CursorMaxPos;
  pIVar5[iVar2].BackupIndent.x = (pIVar4->DC).Indent.x;
  pIVar5[iVar2].BackupGroupOffset.x = (pIVar4->DC).GroupOffset.x;
  pIVar5[iVar2].BackupCurrLineSize = (pIVar4->DC).CurrLineSize;
  pIVar5[iVar2].BackupCurrLineTextBaseOffset = (pIVar4->DC).CurrLineTextBaseOffset;
  pIVar5[iVar2].BackupActiveIdIsAlive = pIVar6->ActiveIdIsAlive;
  pIVar5[iVar2].BackupActiveIdPreviousFrameIsAlive = pIVar6->ActiveIdPreviousFrameIsAlive;
  pIVar5[iVar2].EmitItem = true;
  fVar9 = ((pIVar4->DC).CursorPos.x - (pIVar4->Pos).x) - (pIVar4->DC).ColumnsOffset.x;
  (pIVar4->DC).GroupOffset.x = fVar9;
  (pIVar4->DC).Indent.x = fVar9;
  (pIVar4->DC).CursorMaxPos = (pIVar4->DC).CursorPos;
  (pIVar4->DC).CurrLineSize.x = 0.0;
  (pIVar4->DC).CurrLineSize.y = 0.0;
  if (pIVar6->LogEnabled == true) {
    pIVar6->LogLinePosY = -3.4028235e+38;
  }
  return;
}

Assistant:

void ImGui::BeginGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    g.GroupStack.resize(g.GroupStack.Size + 1);
    ImGuiGroupData& group_data = g.GroupStack.back();
    group_data.WindowID = window->ID;
    group_data.BackupCursorPos = window->DC.CursorPos;
    group_data.BackupCursorMaxPos = window->DC.CursorMaxPos;
    group_data.BackupIndent = window->DC.Indent;
    group_data.BackupGroupOffset = window->DC.GroupOffset;
    group_data.BackupCurrLineSize = window->DC.CurrLineSize;
    group_data.BackupCurrLineTextBaseOffset = window->DC.CurrLineTextBaseOffset;
    group_data.BackupActiveIdIsAlive = g.ActiveIdIsAlive;
    group_data.BackupActiveIdPreviousFrameIsAlive = g.ActiveIdPreviousFrameIsAlive;
    group_data.EmitItem = true;

    window->DC.GroupOffset.x = window->DC.CursorPos.x - window->Pos.x - window->DC.ColumnsOffset.x;
    window->DC.Indent = window->DC.GroupOffset;
    window->DC.CursorMaxPos = window->DC.CursorPos;
    window->DC.CurrLineSize = ImVec2(0.0f, 0.0f);
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce Log carriage return
}